

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

void glob_cleanup(URLGlob *glob)

{
  long local_20;
  curl_off_t elem;
  size_t i;
  URLGlob *glob_local;
  
  if (glob != (URLGlob *)0x0) {
    for (elem = 0; (ulong)elem < glob->size; elem = elem + 1) {
      if ((glob->pattern[elem].type == UPTSet) &&
         (glob->pattern[elem].content.Set.elements != (char **)0x0)) {
        local_20 = glob->pattern[elem].content.Set.size;
        while (local_20 = local_20 + -1, -1 < local_20) {
          free(glob->pattern[elem].content.Set.elements[local_20]);
          glob->pattern[elem].content.Set.elements[local_20] = (char *)0x0;
        }
        free(glob->pattern[elem].content.Set.elements);
        glob->pattern[elem].content.Set.elements = (char **)0x0;
      }
    }
    free(glob->glob_buffer);
    glob->glob_buffer = (char *)0x0;
    free(glob);
  }
  return;
}

Assistant:

void glob_cleanup(struct URLGlob *glob)
{
  size_t i;
  curl_off_t elem;

  if(!glob)
    return;

  for(i = 0; i < glob->size; i++) {
    if((glob->pattern[i].type == UPTSet) &&
       (glob->pattern[i].content.Set.elements)) {
      for(elem = glob->pattern[i].content.Set.size - 1;
          elem >= 0;
          --elem) {
        Curl_safefree(glob->pattern[i].content.Set.elements[elem]);
      }
      Curl_safefree(glob->pattern[i].content.Set.elements);
    }
  }
  Curl_safefree(glob->glob_buffer);
  Curl_safefree(glob);
}